

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  size_t sVar2;
  uchar *local_1e0;
  undefined1 local_1d8 [184];
  undefined1 local_120 [56];
  undefined1 auStack_e8 [20];
  undefined1 local_d4 [44];
  undefined1 auStack_a8 [20];
  uint local_7c;
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined1 auStack_48 [16];
  uint local_38;
  
  uVar1 = lodepng_decode_memory(&local_1e0,w,h,in,insize,colortype,bitdepth);
  if (uVar1 == 0 && local_1e0 != (uchar *)0x0) {
    local_1d8._0_8_ = &PTR__State_02d0aaf8;
    local_1d8._8_4_ = 0;
    local_1d8._16_8_ =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_1d8._24_4_ = 0;
    local_1d8._28_4_ = 0;
    local_1d8._32_4_ = 0;
    local_1d8._36_8_ = 0;
    local_1d8._44_4_ = 1;
    local_1d8._48_4_ = 1;
    local_1d8._52_4_ = 0;
    local_1d8._56_4_ = 2;
    local_1d8._60_4_ = 1;
    local_1d8._64_4_ = 0x800;
    local_1d8._68_4_ = 3;
    local_1d8._72_4_ = 0x80;
    local_1d8._76_4_ = 1;
    local_1d8._80_8_ =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_1d8._88_8_ =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_1d8._96_8_ = (void *)0x0;
    local_1d8._112_4_ = LFS_MINSUM;
    local_1d8._104_4_ = 1;
    local_1d8._108_4_ = 1;
    local_1d8._120_8_ = (uchar *)0x0;
    local_1d8._128_4_ = 0;
    local_1d8._132_4_ = 0;
    local_1d8._136_4_ = 1;
    local_1d8._152_32_ = ZEXT432(0) << 0x40;
    local_120._16_4_ = LCT_RGBA;
    local_120._20_4_ = 8;
    local_120._8_4_ = 0;
    local_120._0_4_ = 0;
    local_120._4_4_ = 0;
    local_7c = 0;
    auStack_68 = SUB3216(ZEXT432(0),0) << 0x40;
    auStack_48 = (undefined1  [16])0x0;
    auStack_e8 = SUB6420(ZEXT464(0),0) << 0x20;
    auStack_a8 = (undefined1  [20])0x0;
    local_d4 = (undefined1  [44])0x0;
    local_38 = 1;
    local_1d8._148_4_ = bitdepth;
    local_1d8._144_4_ = colortype;
    local_120._24_32_ = local_1d8._152_32_;
    local_58 = auStack_48;
    sVar2 = lodepng_get_raw_size(*w,*h,(LodePNGColorMode *)(local_1d8 + 0x90));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_1e0,local_1e0 + sVar2);
    free(local_1e0);
    local_1d8._0_8_ = &PTR__State_02d0aaf8;
    lodepng_state_cleanup((LodePNGState *)local_1d8);
  }
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
                size_t insize, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer;
  unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
  if(buffer && !error)
  {
    State state;
    state.info_raw.colortype = colortype;
    state.info_raw.bitdepth = bitdepth;
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), &buffer[0], &buffer[buffersize]);
    lodepng_free(buffer);
  }
  return error;
}